

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O0

void try_convert_real<unsigned_int,unsigned_int>
               (char *description,bool exp_pass,_func_uint_uint_ptr *fn,uint *i)

{
  uint uVar1;
  ostream *poVar2;
  char *local_88;
  range_error *e;
  uint result;
  bool passed;
  uint *i_local;
  _func_uint_uint_ptr *fn_local;
  bool exp_pass_local;
  char *description_local;
  
  uVar1 = (*fn)(i);
  poVar2 = std::operator<<((ostream *)&std::cout,description);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,uVar1);
  if (exp_pass) {
    local_88 = " PASSED";
  }
  else {
    local_88 = " FAILED";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_88);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
try_convert_real(char const* description, bool exp_pass, To (*fn)(From const&), From const& i)
{
    bool passed = false;
    try {
        To result = fn(i);
        passed = true;
        std::cout << description << ": " << i << " " << result;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}